

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_sendrecv(Curl_easy *data,curltime *nowp)

{
  undefined1 *puVar1;
  connectdata *pcVar2;
  long lVar3;
  long lVar4;
  curl_off_t cVar5;
  curl_trc_feat *pcVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  bool bVar13;
  char *buf;
  _Bool _Var14;
  _Bool _Var15;
  uint uVar16;
  CURLcode CVar17;
  int iVar18;
  uint uVar19;
  timediff_t tVar20;
  size_t sVar21;
  size_t sVar22;
  byte bVar23;
  bool bVar24;
  curltime newer;
  curltime older;
  curltime now;
  char *xfer_buf;
  ssize_t nread;
  _Bool local_61;
  char *local_60;
  size_t local_58;
  long local_50;
  connectdata *local_48;
  curltime *local_40;
  size_t local_38;
  
  bVar23 = (data->state).select_bits;
  if (bVar23 == 0) {
    uVar16 = (data->req).keepon;
  }
  else {
    uVar16 = (data->req).keepon;
    if (((bVar23 & (uVar16 & 0x10) == 0) == 0) &&
       ((byte)((uVar16 & 0x30) == 0 | (uVar16 & 0x20) == 0 & bVar23 >> 1) != 1)) {
      return CURLE_OK;
    }
    (data->state).select_bits = '\0';
  }
  bVar13 = false;
  if ((uVar16 & 1) != 0) {
    pcVar2 = data->conn;
    CVar17 = Curl_multi_xfer_buf_borrow(data,&local_60,&local_38);
    if (CVar17 != CURLE_OK) {
LAB_0015df8a:
      Curl_multi_xfer_buf_release(data,local_60);
      return CVar17;
    }
    iVar18 = 10;
    bVar13 = false;
    local_50 = 0;
    _Var14 = false;
    local_48 = pcVar2;
    local_40 = nowp;
    do {
      if (_Var14 == false) {
        _Var14 = Curl_conn_is_multiplex(local_48,0);
      }
      buf = local_60;
      if (local_38 != 0) {
        sVar21 = (data->set).max_recv_speed;
        sVar22 = local_38;
        if ((long)sVar21 < 1) goto LAB_0015e043;
        if (local_50 == 0) {
          if ((long)sVar21 < (long)local_38) {
            sVar22 = sVar21;
          }
          goto LAB_0015e043;
        }
LAB_0015e295:
        if (iVar18 < 1) break;
        uVar16 = data->conn->handler->protocol;
        iVar18 = 1;
        if ((uVar16 & 0xc) == 0) {
          if ((uVar16 & 0x30) != 0) break;
          iVar18 = 0;
        }
        _Var15 = Curl_conn_data_pending(data,iVar18);
        if (!_Var15) {
          uVar16 = (data->req).keepon;
          goto LAB_0015e355;
        }
        break;
      }
      sVar22 = 0;
LAB_0015e043:
      if (((_Var14 != false) || (((data->req).field_0xd1 & 1) != 0)) ||
         (lVar4 = (data->req).size, lVar4 == -1)) {
        pcVar2 = data->conn;
        if ((pcVar2 == (connectdata *)0x0) || (pcVar2->sockfd == -1)) {
LAB_0015e116:
          sVar21 = sVar22;
          if (sVar22 != 0) goto LAB_0015e11e;
        }
        else {
          _Var15 = Curl_shutdown_started(data,(uint)(pcVar2->sockfd == pcVar2->sock[1]));
          if ((sVar22 != 0) && (sVar21 = sVar22, !_Var15)) goto LAB_0015e11e;
        }
LAB_0015e0b2:
        local_58 = 0;
LAB_0015e0bb:
        if (((data->req).field_0xd3 & 0x10) != 0) {
          pcVar2 = data->conn;
          CVar17 = CURLE_FAILED_INIT;
          if (((pcVar2 != (connectdata *)0x0) && (pcVar2->sockfd != -1)) &&
             ((CVar17 = Curl_conn_shutdown(data,(uint)(pcVar2->sockfd == pcVar2->sock[1]),&local_61)
              , CVar17 == CURLE_OK && (CVar17 = CURLE_AGAIN, local_61 == true)))) goto LAB_0015e1ee;
LAB_0015e138:
          if (CVar17 != CURLE_AGAIN) goto LAB_0015df8a;
          if ((*(uint *)&(data->req).field_0xd1 & 0x22008) != 0x20008) goto LAB_0015e295;
        }
LAB_0015e159:
        CVar17 = Curl_req_stop_send_recv(data);
        if (CVar17 == CURLE_OK) {
          if (((data->req).field_0xd1 & 0x10) == 0) {
            bVar23 = 0;
            CVar17 = Curl_xfer_write_resp(data,buf,0,true);
            goto LAB_0015e18d;
          }
LAB_0015e28f:
          bVar13 = true;
          goto LAB_0015e295;
        }
        goto LAB_0015df8a;
      }
      lVar3 = (data->req).bytecount;
      sVar21 = lVar4 - lVar3;
      if (sVar21 == 0 || lVar4 < lVar3) goto LAB_0015e0b2;
      if ((long)sVar22 <= (long)sVar21) goto LAB_0015e116;
LAB_0015e11e:
      CVar17 = Curl_xfer_recv(data,buf,sVar21,(ssize_t *)&local_58);
      if (CVar17 != CURLE_OK) goto LAB_0015e138;
      if (local_58 == 0) goto LAB_0015e0bb;
LAB_0015e1ee:
      if ((long)local_58 < 0) goto LAB_0015e3a5;
      if (local_58 == 0) goto LAB_0015e159;
      local_50 = local_50 + local_58;
      CVar17 = Curl_xfer_write_resp(data,buf,local_58,false);
      bVar23 = 1;
LAB_0015e18d:
      if (CVar17 != CURLE_OK) goto LAB_0015df8a;
      uVar16 = *(uint *)&(data->req).field_0xd1;
      if ((uVar16 & 2) != 0) {
        bVar13 = true;
        goto LAB_0015e3a5;
      }
      uVar19 = (data->req).keepon;
      if ((bVar23 & ((uVar16 & 8) == 0 | _Var14)) == 0) {
        uVar19 = uVar19 & 0xfffffffe;
        (data->req).keepon = uVar19;
      }
      if ((uVar19 & 0x11) != 1) goto LAB_0015e28f;
      bVar13 = true;
      bVar24 = iVar18 != 0;
      iVar18 = iVar18 + -1;
    } while (bVar24);
    uVar16 = (data->req).keepon;
    (data->state).select_bits = ((uVar16 & 0x2a) == 2) * '\x02' + '\x01';
LAB_0015e355:
    if (((uVar16 & 3) == 2) && ((((ulong)local_48->bits & 0x20) != 0 || (_Var14 != false)))) {
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        Curl_infof(data,"we are done reading and this is set to close, stop send");
      }
      Curl_req_abort_sending(data);
    }
LAB_0015e3a5:
    Curl_multi_xfer_buf_release(data,local_60);
    nowp = local_40;
    if (((data->req).field_0xd1 & 2) != 0) {
      return CURLE_OK;
    }
  }
  _Var14 = Curl_req_want_send(data);
  if (((!_Var14) && (((data->req).keepon & 0x40) == 0)) ||
     (_Var14 = Curl_req_done_sending(data), _Var14)) {
    if (bVar13) goto LAB_0015dfa8;
    CVar17 = Curl_conn_ev_data_idle(data);
  }
  else {
    CVar17 = Curl_req_send_more(data);
  }
  if (CVar17 != CURLE_OK) {
    return CVar17;
  }
LAB_0015dfa8:
  iVar18 = Curl_pgrsUpdate(data);
  if (iVar18 != 0) {
    return CURLE_ABORTED_BY_CALLBACK;
  }
  uVar7 = nowp->tv_sec;
  uVar8 = nowp->tv_usec;
  now.tv_usec = uVar8;
  now.tv_sec = uVar7;
  now._12_4_ = 0;
  CVar17 = Curl_speedcheck(data,now);
  if (CVar17 != CURLE_OK) {
    return CVar17;
  }
  if ((data->req).keepon == 0) {
    if (((((data->req).field_0xd3 & 2) == 0) && (lVar4 = (data->req).size, lVar4 != -1)) &&
       ((lVar4 != (data->req).bytecount && ((data->req).newurl == (char *)0x0)))) {
      Curl_failf(data,"transfer closed with %ld bytes remaining to read");
      return CURLE_PARTIAL_FILE;
    }
    iVar18 = Curl_pgrsUpdate(data);
    if (iVar18 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  else {
    tVar20 = Curl_timeleft(data,nowp,false);
    if (tVar20 < 0) {
      lVar4 = (data->req).size;
      uVar9 = nowp->tv_sec;
      uVar10 = nowp->tv_usec;
      newer.tv_usec = uVar10;
      newer.tv_sec = uVar9;
      uVar11 = (data->progress).t_startsingle.tv_sec;
      uVar12 = (data->progress).t_startsingle.tv_usec;
      older.tv_usec = uVar12;
      older.tv_sec = uVar11;
      newer._12_4_ = 0;
      older._12_4_ = 0;
      tVar20 = Curl_timediff(newer,older);
      cVar5 = (data->req).bytecount;
      if (lVar4 == -1) {
        Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",tVar20,
                   cVar5);
      }
      else {
        Curl_failf(data,
                   "Operation timed out after %ld milliseconds with %ld out of %ld bytes received",
                   tVar20,cVar5,(data->req).size);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  if (((data->req).keepon & 0x3f) == 0) {
    puVar1 = &(data->req).field_0xd1;
    *puVar1 = *puVar1 | 2;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_sendrecv(struct Curl_easy *data, struct curltime *nowp)
{
  struct SingleRequest *k = &data->req;
  CURLcode result = CURLE_OK;
  int didwhat = 0;

  DEBUGASSERT(nowp);
  if(data->state.select_bits) {
    if(select_bits_paused(data, data->state.select_bits)) {
      /* leave the bits unchanged, so they'll tell us what to do when
       * this transfer gets unpaused. */
      result = CURLE_OK;
      goto out;
    }
    data->state.select_bits = 0;
  }

  /* We go ahead and do a read if we have a readable socket or if the stream
     was rewound (in which case we have data in a buffer) */
  if(k->keepon & KEEP_RECV) {
    result = sendrecv_dl(data, k, &didwhat);
    if(result || data->req.done)
      goto out;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if(Curl_req_want_send(data) || (data->req.keepon & KEEP_SEND_TIMED)) {
    result = sendrecv_ul(data, &didwhat);
    if(result)
      goto out;
  }

  if(!didwhat) {
    /* Transfer wanted to send/recv, but nothing was possible. */
    result = Curl_conn_ev_data_idle(data);
    if(result)
      goto out;
  }

  if(Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, *nowp);
  if(result)
    goto out;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, nowp, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " out of %"
              FMT_OFF_T " bytes received",
              Curl_timediff(*nowp, data->progress.t_startsingle),
              k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " bytes received",
              Curl_timediff(*nowp, data->progress.t_startsingle),
              k->bytecount);
      }
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */
    if(!(data->req.no_body) && (k->size != -1) &&
       (k->bytecount != k->size) && !k->newurl) {
      failf(data, "transfer closed with %" FMT_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      result = CURLE_PARTIAL_FILE;
      goto out;
    }
    if(Curl_pgrsUpdate(data)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

  /* If there is nothing more to send/recv, the request is done */
  if(0 == (k->keepon&(KEEP_RECVBITS|KEEP_SENDBITS)))
    data->req.done = TRUE;

out:
  if(result)
    DEBUGF(infof(data, "Curl_sendrecv() -> %d", result));
  return result;
}